

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<double>::squeeze(QList<double> *this)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<double> *this_00;
  DataOps *pDVar3;
  QArrayDataPointer<double> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<double> *in_stack_ffffffffffffff98;
  QArrayDataPointer<double> *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  QFlagsStorage<QArrayData::ArrayOption> f;
  qsizetype in_stack_ffffffffffffffb0;
  qsizetype in_stack_ffffffffffffffb8;
  QArrayDataPointer<double> *in_stack_ffffffffffffffc0;
  QArrayDataPointer<double> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<double>::isMutable(in_RDI);
  if (!bVar1) goto LAB_005c4fe6;
  QArrayDataPointer<double>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<double>::needsDetach(in_stack_ffffffffffffffa0);
  if (bVar1) {
LAB_005c4ea3:
    local_20.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.ptr = (double *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    size((QList<double> *)in_RDI);
    QArrayDataPointer<double>::QArrayDataPointer
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               (AllocationOption)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    qVar2 = size((QList<double> *)in_RDI);
    if (qVar2 != 0) {
      bVar1 = QArrayDataPointer<double>::needsDetach(in_stack_ffffffffffffffa0);
      if (bVar1) {
        this_00 = (QPodArrayOps<double> *)QArrayDataPointer<double>::operator->(&local_20);
        QArrayDataPointer<double>::data(in_RDI);
        QArrayDataPointer<double>::data(in_RDI);
        QtPrivate::QPodArrayOps<double>::copyAppend
                  (this_00,in_stack_ffffffffffffffa8,(double *)in_stack_ffffffffffffffa0);
      }
      else {
        in_stack_ffffffffffffffa0 =
             (QArrayDataPointer<double> *)QArrayDataPointer<double>::operator->(&local_20);
        in_stack_ffffffffffffffa8 = QArrayDataPointer<double>::data(in_RDI);
        QArrayDataPointer<double>::data(in_RDI);
        QtPrivate::QPodArrayOps<double>::moveAppend
                  ((QPodArrayOps<double> *)in_stack_ffffffffffffffa0,
                   (double *)in_stack_ffffffffffffff98,(double *)0x5c4fa1);
      }
    }
    QArrayDataPointer<double>::swap(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QArrayDataPointer<double>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    in_stack_ffffffffffffffc0 = (QArrayDataPointer<double> *)size((QList<double> *)in_RDI);
    qVar2 = capacity((QList<double> *)0x5c4e92);
    if ((long)in_stack_ffffffffffffffc0 < qVar2) goto LAB_005c4ea3;
  }
  f.i = (Int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  pDVar3 = QArrayDataPointer<double>::operator->(in_RDI);
  QFlags<QArrayData::ArrayOption>::QFlags
            ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffffa0,
             (ArrayOption)((ulong)pDVar3 >> 0x20));
  QArrayDataPointer<double>::clearFlag(in_stack_ffffffffffffffa0,(ArrayOptions)f.i);
LAB_005c4fe6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QList<T>::squeeze()
{
    if (!d.isMutable())
        return;
    if (d->needsDetach() || size() < capacity()) {
        // must allocate memory
        DataPointer detached(size());
        if (size()) {
            if (d.needsDetach())
                detached->copyAppend(d.data(), d.data() + d.size);
            else
                detached->moveAppend(d.data(), d.data() + d.size);
        }
        d.swap(detached);
    }
    // We're detached so this is fine
    d->clearFlag(Data::CapacityReserved);
}